

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeDependencies.cpp
# Opt level: O0

TimeData *
helics::generateMinTimeDownstream
          (TimeDependencies *dependencies,bool restricted,GlobalFederateId self,
          GlobalFederateId ignore,int32_t responseCode)

{
  bool bVar1;
  reference pDVar2;
  DependencyInfo *pDVar3;
  GlobalFederateId in_ECX;
  byte in_DL;
  undefined8 in_RSI;
  TimeData *in_RDI;
  undefined4 in_R8D;
  GlobalFederateId unaff_retaddr;
  GlobalFederateId unaff_retaddr_00;
  TimeData *mTime;
  DependencyInfo *res;
  DependencyInfo *dep;
  const_iterator __end1;
  const_iterator __begin1;
  TimeDependencies *__range1;
  TimeData *__lhs;
  int32_t in_stack_ffffffffffffffac;
  DependencyInfo *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  BaseType in_stack_ffffffffffffffbc;
  Time in_stack_ffffffffffffffc0;
  __normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
  local_30 [2];
  baseType local_20;
  byte local_11;
  ConnectionType ignoreType;
  GlobalFederateId GVar4;
  
  local_11 = in_DL & 1;
  __lhs = in_RDI;
  local_20 = (baseType)TimeRepresentation<count_time<9,_long>_>::maxVal();
  TimeData::TimeData((TimeData *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                     in_stack_ffffffffffffffc0,(TimeState)((ulong)in_stack_ffffffffffffffb0 >> 0x38)
                     ,(uint8_t)((ulong)in_stack_ffffffffffffffb0 >> 0x30));
  local_30[0]._M_current = (DependencyInfo *)TimeDependencies::begin((TimeDependencies *)in_RDI);
  TimeDependencies::end((TimeDependencies *)in_RDI);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                      ((__normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                        *)__lhs,(__normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                                 *)in_RDI);
    ignoreType = (ConnectionType)((ulong)in_RSI >> 0x38);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    pDVar2 = __gnu_cxx::
             __normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
             ::operator*(local_30);
    if ((((pDVar2->dependency & 1U) != 0) && (pDVar2->connection == PARENT)) &&
       ((bVar1 = GlobalFederateId::isValid((GlobalFederateId *)&stack0xfffffffffffffffc), !bVar1 ||
        (GVar4.gid = in_ECX.gid,
        bVar1 = GlobalFederateId::operator==(&(pDVar2->super_TimeData).minFedActual,in_ECX),
        in_stack_ffffffffffffffbc = in_ECX.gid, in_ECX.gid = GVar4.gid, !bVar1)))) {
      generateMinTimeImplementation
                ((TimeData *)CONCAT44(in_stack_ffffffffffffffbc,in_R8D),in_stack_ffffffffffffffb0,
                 (GlobalFederateId)(BaseType)((ulong)pDVar2 >> 0x20),in_stack_ffffffffffffffac);
    }
    __gnu_cxx::
    __normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
    ::operator++(local_30);
  }
  bVar1 = TimeRepresentation<count_time<9,_long>_>::operator<(&__lhs->Te,&__lhs->minDe);
  if (bVar1) {
    (__lhs->minDe).internalTimeCode = (__lhs->Te).internalTimeCode;
  }
  if (((local_11 & 1) == 0) &&
     (bVar1 = TimeRepresentation<count_time<9,_long>_>::operator>(&__lhs->minDe,&__lhs->next), bVar1
     )) {
    (__lhs->next).internalTimeCode = (__lhs->minDe).internalTimeCode;
  }
  if (__lhs->mTimeState < time_granted) {
    (__lhs->next).internalTimeCode = -1;
    (__lhs->minDe).internalTimeCode = -1;
    (__lhs->Te).internalTimeCode = -1;
    if (__lhs->mTimeState < exec_requested) {
      pDVar3 = getExecEntryMinFederate
                         ((TimeDependencies *)CONCAT44(in_ECX.gid,in_R8D),unaff_retaddr_00,
                          ignoreType,unaff_retaddr);
      (__lhs->minFed).gid = (pDVar3->fedID).gid;
    }
  }
  return in_RDI;
}

Assistant:

TimeData generateMinTimeDownstream(const TimeDependencies& dependencies,
                                   bool restricted,
                                   GlobalFederateId self,
                                   GlobalFederateId ignore,
                                   std::int32_t responseCode)
{
    TimeData mTime(Time::maxVal(), TimeState::error);
    for (const auto& dep : dependencies) {
        if (!dep.dependency) {
            continue;
        }
        if (dep.connection != ConnectionType::PARENT) {
            continue;
        }
        if (self.isValid() && dep.minFedActual == self) {
            continue;
        }
        generateMinTimeImplementation(mTime, dep, ignore, responseCode);
    }
    if (mTime.Te < mTime.minDe) {
        mTime.minDe = mTime.Te;
    }

    if (!restricted) {
        if (mTime.minDe > mTime.next) {
            mTime.next = mTime.minDe;
        }
    }
    if (mTime.mTimeState < TimeState::time_granted) {
        mTime.next = initializationTime;
        mTime.minDe = initializationTime;
        mTime.Te = initializationTime;

        if (mTime.mTimeState < TimeState::exec_requested) {
            const auto& res =
                getExecEntryMinFederate(dependencies, self, ConnectionType::CHILD, ignore);
            mTime.minFed = res.fedID;
        }
    }
    return mTime;
}